

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_fm.hpp
# Opt level: O1

ssize_t __thiscall
ymfm::fm_engine_base<ymfm::opn_registers_base<true>_>::write
          (fm_engine_base<ymfm::opn_registers_base<true>_> *this,int __fd,void *__buf,size_t __n)

{
  fm_operator<ymfm::opn_registers_base<true>_> *pfVar1;
  int iVar2;
  undefined8 in_RAX;
  undefined4 extraout_var;
  fm_channel<ymfm::opn_registers_base<true>_> *pfVar3;
  long lVar4;
  uint32_t keyon_opmask;
  uint32_t keyon_channel;
  undefined8 local_18;
  
  if (__fd == 0x27) {
    iVar2 = (**this->m_intf->_vptr_ymfm_interface)(this->m_intf,(ulong)__buf & 0xff);
    return CONCAT44(extraout_var,iVar2);
  }
  this->m_modified_channels = 0x3f;
  local_18 = in_RAX;
  pfVar3 = (fm_channel<ymfm::opn_registers_base<true>_> *)
           opn_registers_base<true>::write
                     (&this->m_regs,__fd & 0xffff,(void *)((ulong)__buf & 0xff),(long)&local_18 + 4)
  ;
  if ((local_18._4_4_ < 6 & (byte)pfVar3) == 1) {
    pfVar3 = this->m_channel[local_18._4_4_]._M_t.
             super___uniq_ptr_impl<ymfm::fm_channel<ymfm::opn_registers_base<true>_>,_std::default_delete<ymfm::fm_channel<ymfm::opn_registers_base<true>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_ymfm::fm_channel<ymfm::opn_registers_base<true>_>_*,_std::default_delete<ymfm::fm_channel<ymfm::opn_registers_base<true>_>_>_>
             .super__Head_base<0UL,_ymfm::fm_channel<ymfm::opn_registers_base<true>_>_*,_false>.
             _M_head_impl;
    lVar4 = 0;
    do {
      pfVar1 = pfVar3->m_op[lVar4];
      if (pfVar1 != (fm_operator<ymfm::opn_registers_base<true>_> *)0x0) {
        pfVar1->m_keyon_live =
             ((uint)local_18 >> ((uint)lVar4 & 0x1f) & 1) != 0 | pfVar1->m_keyon_live & 0xfe;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
  }
  return (ssize_t)pfVar3;
}

Assistant:

void fm_engine_base<RegisterType>::write(uint16_t regnum, uint8_t data)
{
	debug::log_fm_write("%03X = %02X\n", regnum, data);

	// special case: writes to the mode register can impact IRQs;
	// schedule these writes to ensure ordering with timers
	if (regnum == RegisterType::REG_MODE)
	{
		m_intf.ymfm_sync_mode_write(data);
		return;
	}

	// for now just mark all channels as modified
	m_modified_channels = ALL_CHANNELS;

	// most writes are passive, consumed only when needed
	uint32_t keyon_channel;
	uint32_t keyon_opmask;
	if (m_regs.write(regnum, data, keyon_channel, keyon_opmask))
	{
		// handle writes to the keyon register(s)
		if (keyon_channel < CHANNELS)
		{
			// normal channel on/off
			m_channel[keyon_channel]->keyonoff(keyon_opmask, KEYON_NORMAL, keyon_channel);
		}
		else if (CHANNELS >= 9 && keyon_channel == RegisterType::RHYTHM_CHANNEL)
		{
			// special case for the OPL rhythm channels
			m_channel[6]->keyonoff(bitfield(keyon_opmask, 4) ? 3 : 0, KEYON_RHYTHM, 6);
			m_channel[7]->keyonoff(bitfield(keyon_opmask, 0) | (bitfield(keyon_opmask, 3) << 1), KEYON_RHYTHM, 7);
			m_channel[8]->keyonoff(bitfield(keyon_opmask, 2) | (bitfield(keyon_opmask, 1) << 1), KEYON_RHYTHM, 8);
		}
	}
}